

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

bool __thiscall Qentem::QExpression::operator>=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  QExpression *right_local;
  QExpression *this_local;
  
  EVar1 = this->Type;
  if (EVar1 == RealNumber) {
    if (right->Type != RealNumber) {
      return (double)(long)(right->field_0).SubExpressions.storage_ <= *(double *)&this->field_0;
    }
  }
  else {
    if (EVar1 == NaturalNumber) {
      if (right->Type == RealNumber) {
        auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,(this->field_0).SubExpressions.storage_);
        return *(double *)&right->field_0 <= auVar2._0_8_;
      }
      return (long)(right->field_0).SubExpressions.storage_ <=
             (long)(this->field_0).SubExpressions.storage_;
    }
    if (EVar1 == IntegerNumber) {
      if (right->Type == RealNumber) {
        return *(double *)&right->field_0 <= (double)(long)(this->field_0).SubExpressions.storage_;
      }
      return (long)(right->field_0).SubExpressions.storage_ <=
             (long)(this->field_0).SubExpressions.storage_;
    }
  }
  return *(double *)&right->field_0 <= *(double *)&this->field_0;
}

Assistant:

bool operator>=(const QExpression &right) const noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    return (double(Value.Number.Natural) >= right.Value.Number.Real);
                }

                return (Value.Number.Integer >= right.Value.Number.Integer);
            }

            case ExpressionType::IntegerNumber: {
                if (right.Type == ExpressionType::RealNumber) {
                    return (double(Value.Number.Integer) >= right.Value.Number.Real);
                }

                return (Value.Number.Integer >= right.Value.Number.Integer);
            }

            case ExpressionType::RealNumber: {
                if (right.Type != ExpressionType::RealNumber) {
                    return (Value.Number.Real >= double(right.Value.Number.Integer));
                }
            }

            default: {
            }
        }

        return (Value.Number.Real >= right.Value.Number.Real);
    }